

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipoleAdapter.cpp
# Opt level: O2

MultipoleAtypeParameters * __thiscall
OpenMD::MultipoleAdapter::getMultipoleParam
          (MultipoleAtypeParameters *__return_storage_ptr__,MultipoleAdapter *this)

{
  bool bVar1;
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::MultipoleAtypeParameters>_> multipoleData;
  shared_ptr<OpenMD::GenericData> data;
  shared_ptr<OpenMD::GenericData> local_68;
  undefined1 local_58 [16];
  string local_48;
  
  bVar1 = isMultipole(this);
  if (!bVar1) {
    AtomType::getName_abi_cxx11_(&local_48,this->at_);
    snprintf(painCave.errMsg,2000,
             "MultipoleAdapter::getMultipoleParam was passed an atomType (%s)\n\tthat does not appear to be a Multipole atom.\n"
             ,local_48._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_48);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  AtomType::getPropertyByName((AtomType *)local_58,(string *)this->at_);
  if ((_func_int **)local_58._0_8_ == (_func_int **)0x0) {
    AtomType::getName_abi_cxx11_(&local_48,this->at_);
    snprintf(painCave.errMsg,2000,
             "MultipoleAdapter::getMultipoleParam could not find Multipole\n\tparameters for atomType %s.\n"
             ,local_48._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_48);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  std::
  dynamic_pointer_cast<OpenMD::SimpleTypeData<OpenMD::MultipoleAtypeParameters>,OpenMD::GenericData>
            (&local_68);
  if (local_68.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    AtomType::getName_abi_cxx11_(&local_48,this->at_);
    snprintf(painCave.errMsg,2000,
             "MultipoleAdapter::getMultipoleParam could not convert\n\tGenericData to MultipoleAtypeData for atom type %s\n"
             ,local_48._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_48);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  MultipoleAtypeParameters::MultipoleAtypeParameters
            (__return_storage_ptr__,
             (MultipoleAtypeParameters *)
             (local_68.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
             1));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_68.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
  return __return_storage_ptr__;
}

Assistant:

MultipoleAtypeParameters MultipoleAdapter::getMultipoleParam() {
    if (!isMultipole()) {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "MultipoleAdapter::getMultipoleParam was passed an atomType (%s)\n"
          "\tthat does not appear to be a Multipole atom.\n",
          at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<GenericData> data = at_->getPropertyByName(MultipoleTypeID);
    if (data == nullptr) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "MultipoleAdapter::getMultipoleParam could not find Multipole\n"
               "\tparameters for atomType %s.\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<MultipoleAtypeData> multipoleData =
        std::dynamic_pointer_cast<MultipoleAtypeData>(data);
    if (multipoleData == nullptr) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "MultipoleAdapter::getMultipoleParam could not convert\n"
               "\tGenericData to MultipoleAtypeData for atom type %s\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    return multipoleData->getData();
  }